

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeInsert(BtCursor *pCur,BtreePayload *pX,int flags,int seekResult)

{
  byte bVar1;
  ushort uVar2;
  Btree *pBtree;
  BtShared *pBVar3;
  Pgno parent;
  BtreePayload *pBVar4;
  BtCursor *pCur_00;
  char cVar5;
  int iVar6;
  void *__dest;
  uint *puVar7;
  uint *__src;
  uint *pRC;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  MemPage *pMVar13;
  u8 *__s;
  uint *unaff_R15;
  uint *puVar14;
  int rc;
  int loc;
  int rc_1;
  MemPage *pOvfl;
  uint local_9c;
  int local_98;
  Pgno local_94;
  uint *local_90;
  uint local_88;
  int local_84;
  uint local_80;
  uint local_7c;
  MemPage *local_78;
  KeyInfo *local_70;
  uint *local_68;
  BtreePayload *local_60;
  uint *local_58;
  UnpackedRecord local_50;
  BtCursor *local_38;
  
  if (pCur->eState == '\x04') {
    return pCur->skipNext;
  }
  pBtree = pCur->pBtree;
  pBVar3 = pBtree->pBt;
  local_98 = seekResult;
  if (((pCur->curFlags & 0x20) != 0) &&
     (local_9c = saveAllCursors(pBVar3,pCur->pgnoRoot,pCur), unaff_R15 = (uint *)(ulong)(uint)flags,
     local_9c != 0)) {
    return local_9c;
  }
  local_50.pKeyInfo = pCur->pKeyInfo;
  local_84 = flags;
  if (local_50.pKeyInfo != (KeyInfo *)0x0) {
    if ((flags & 2U) == 0 && seekResult == 0) {
      if (pX->nMem == 0) {
        local_9c = btreeMoveto(pCur,pX->pKey,pX->nKey,(uint)(flags != 0),&local_98);
      }
      else {
        local_50.aMem = pX->aMem;
        local_50.default_rc = '\0';
        local_50.errCode = '\0';
        local_50.r1 = '\0';
        local_50.r2 = '\0';
        local_50._22_2_ = local_50._22_2_ & 0xff00;
        local_50.nField = pX->nMem;
        local_9c = sqlite3BtreeMovetoUnpacked(pCur,&local_50,0,(uint)(flags != 0),&local_98);
      }
      unaff_R15 = (uint *)(ulong)local_9c;
      if (local_9c != 0) {
        return local_9c;
      }
    }
    goto LAB_001370f5;
  }
  invalidateIncrblobCursors(pBtree,pX->nKey,0);
  if ((pCur->curFlags & 2) != 0) {
    if (pX->nKey == (pCur->info).nKey) {
      local_98 = 0;
      goto LAB_001370f5;
    }
    if ((((pCur->curFlags & 2) != 0) && (0 < pX->nKey)) && ((pCur->info).nKey == pX->nKey + -1)) {
      local_98 = -1;
      goto LAB_001370f5;
    }
  }
  if (seekResult == 0) {
    iVar6 = sqlite3BtreeMovetoUnpacked
                      (pCur,(UnpackedRecord *)0x0,pX->nKey,(uint)(local_84 != 0),&local_98);
    if (iVar6 != 0) {
      return iVar6;
    }
    local_9c = 0;
  }
LAB_001370f5:
  pMVar13 = pCur->apPage[pCur->iPage];
  puVar14 = (uint *)pBVar3->pTmpSpace;
  local_50.pKeyInfo = (KeyInfo *)0x0;
  pBVar3 = pMVar13->pBt;
  local_94 = 0;
  bVar1 = pMVar13->childPtrSize;
  uVar12 = (ulong)bVar1;
  local_90 = puVar14;
  local_78 = pMVar13;
  local_60 = pX;
  local_38 = pCur;
  if (pMVar13->intKey == '\0') {
    __src = (uint *)pX->pKey;
    puVar7 = (uint *)pX->nKey;
    if ((uint)puVar7 < 0x80) {
      *(u8 *)((long)puVar14 + uVar12) = (u8)puVar7;
      uVar11 = 1;
    }
    else {
      uVar11 = sqlite3PutVarint((uchar *)((long)puVar14 + uVar12),(long)(int)(uint)puVar7);
      uVar11 = uVar11 & 0xff;
      unaff_R15 = puVar7;
    }
    iVar6 = uVar11 + bVar1;
    pRC = (uint *)((ulong)puVar7 & 0xffffffff);
    local_58 = local_90;
  }
  else {
    puVar7 = (uint *)(long)pX->nData;
    pRC = (uint *)((long)pX->nZero + (long)puVar7);
    local_68 = (uint *)pX->pData;
    if ((uint)pRC < 0x80) {
      *(u8 *)((long)puVar14 + uVar12) = (u8)pRC;
      uVar11 = 1;
    }
    else {
      uVar11 = sqlite3PutVarint((uchar *)(uVar12 + (long)puVar14),(u64)pRC);
      uVar11 = uVar11 & 0xff;
    }
    uVar11 = uVar11 + bVar1;
    iVar6 = sqlite3PutVarint((uchar *)((ulong)uVar11 + (long)puVar14),local_60->nKey);
    iVar6 = iVar6 + uVar11;
    local_58 = puVar14;
    __src = local_68;
    pMVar13 = local_78;
    unaff_R15 = pRC;
  }
  iVar8 = (int)pRC;
  if ((int)(uint)pMVar13->maxLocal < iVar8) {
    uVar2 = pMVar13->minLocal;
    uVar11 = (iVar8 - (uint)uVar2) % (pMVar13->pBt->usableSize - 4) + (uint)uVar2;
    if ((int)(uint)pMVar13->maxLocal < (int)uVar11) {
      uVar11 = (uint)uVar2;
    }
    uVar12 = (ulong)uVar11;
    local_88 = uVar11 + iVar6 + 4;
    local_58 = (uint *)((long)(int)(uVar11 + iVar6) + (long)local_58);
  }
  else {
    local_88 = 4;
    if (4 < iVar8 + iVar6) {
      local_88 = iVar8 + iVar6;
    }
    uVar12 = (ulong)pRC & 0xffffffff;
  }
  if (iVar8 < 1) {
    local_70 = (KeyInfo *)0x0;
    puVar7 = unaff_R15;
  }
  else {
    __s = (u8 *)((long)iVar6 + (long)local_90);
    local_70 = (KeyInfo *)0x0;
    do {
      parent = local_94;
      iVar6 = (int)uVar12;
      if (iVar6 == 0) {
        if (pBVar3->autoVacuum != '\0') {
          do {
            uVar9 = local_94;
            local_94 = uVar9 + 1;
            uVar11 = 0;
            if (1 < local_94) {
              iVar6 = (uVar9 - 1) - (uVar9 - 1) % (pBVar3->usableSize / 5 + 1);
              uVar11 = iVar6 + (uint)(iVar6 + 1U == (uint)sqlite3PendingByte / pBVar3->pageSize) + 2
              ;
            }
          } while ((local_94 == uVar11) || (uVar9 == (uint)sqlite3PendingByte / pBVar3->pageSize));
          local_94 = uVar9 + 1;
        }
        local_68 = __src;
        local_7c = allocateBtreePage(pBVar3,(MemPage **)&local_50,&local_94,local_94,'\0');
        if (((local_7c == 0 && pBVar3->autoVacuum != '\0') &&
            (ptrmapPut(pBVar3,local_94,'\x04' - (parent == 0),parent,(int *)&local_7c),
            local_7c != 0)) && (local_50.pKeyInfo != (KeyInfo *)0x0)) {
          sqlite3PagerUnrefNotNull((DbPage *)local_50.pKeyInfo[2].aColl[0]);
        }
        uVar11 = local_7c;
        if (local_7c == 0) {
          *local_58 = local_94 >> 0x18 | (local_94 & 0xff0000) >> 8 | (local_94 & 0xff00) << 8 |
                      local_94 << 0x18;
          if (local_70 != (KeyInfo *)0x0) {
            sqlite3PagerUnrefNotNull((DbPage *)local_70[2].aColl[0]);
          }
          local_58 = *(uint **)(local_50.pKeyInfo + 2);
          *local_58 = 0;
          local_70 = local_50.pKeyInfo;
          __s = (u8 *)(*(long *)(local_50.pKeyInfo + 2) + 4);
          iVar6 = pBVar3->usableSize - 4;
        }
        else {
          iVar6 = 0;
          if (local_70 != (KeyInfo *)0x0) {
            sqlite3PagerUnrefNotNull((DbPage *)local_70[2].aColl[0]);
          }
          local_80 = uVar11;
        }
        __src = local_68;
        if (uVar11 != 0) goto LAB_0013749c;
      }
      iVar8 = iVar6;
      if ((int)pRC < iVar6) {
        iVar8 = (int)pRC;
      }
      iVar10 = (int)puVar7;
      local_68 = pRC;
      if (iVar10 < 1) {
        memset(__s,0,(long)iVar8);
      }
      else {
        if (iVar10 <= iVar8) {
          iVar8 = iVar10;
        }
        memcpy(__s,__src,(long)iVar8);
      }
      __s = __s + iVar8;
      __src = (uint *)((long)__src + (long)iVar8);
      puVar7 = (uint *)(ulong)(uint)(iVar10 - iVar8);
      uVar12 = (ulong)(uint)(iVar6 - iVar8);
      uVar11 = (int)local_68 - iVar8;
      pRC = (uint *)(ulong)uVar11;
    } while (uVar11 != 0 && iVar8 <= (int)local_68);
  }
  if (local_70 != (KeyInfo *)0x0) {
    sqlite3PagerUnrefNotNull((DbPage *)local_70[2].aColl[0]);
  }
  local_80 = 0;
  pRC = puVar7;
LAB_0013749c:
  pCur_00 = local_38;
  pBVar4 = local_60;
  pMVar13 = local_78;
  local_9c = local_80;
  if (local_80 == 0) {
    uVar2 = local_38->aiIdx[local_38->iPage];
    uVar11 = (uint)uVar2;
    if (local_98 == 0) {
      local_9c = sqlite3PagerWrite(local_78->pDbPage);
      if (local_9c == 0) {
        puVar14 = (uint *)(pMVar13->aData +
                          (CONCAT11(pMVar13->aCellIdx[(ulong)uVar2 * 2],
                                    pMVar13->aCellIdx[(ulong)uVar2 * 2 + 1]) & pMVar13->maskPage));
        if (pMVar13->leaf == '\0') {
          *local_90 = *puVar14;
        }
        local_9c = clearCell(pMVar13,(uchar *)puVar14,(CellInfo *)&local_50);
        pMVar13 = local_78;
        if ((local_88 == (ushort)local_50._22_2_) &&
           (CONCAT22(local_50._18_2_,local_50.nField) == (uint)(ushort)local_50._20_2_)) {
          if (local_78->aDataEnd < (u8 *)((long)puVar14 + (ulong)local_88)) {
            pRC = (uint *)0xb;
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x1058f);
            cVar5 = '\x01';
          }
          else {
            memcpy(puVar14,local_90,(ulong)local_88);
            cVar5 = '\x01';
            pRC = (uint *)0x0;
          }
        }
        else {
          pRC = &local_9c;
          dropCell(local_78,(uint)uVar2,(uint)(ushort)local_50._22_2_,(int *)pRC);
          cVar5 = (local_9c != 0) * '\x02';
        }
      }
      else {
        cVar5 = '\x02';
      }
      if (cVar5 != '\0') {
        if (cVar5 == '\x02') {
          return local_9c;
        }
        return (int)pRC;
      }
    }
    else if ((local_98 < 0) && (local_78->nCell != 0)) {
      local_38->aiIdx[local_38->iPage] = uVar2 + 1;
      uVar11 = (uint)(ushort)(uVar2 + 1);
    }
    insertCell(pMVar13,uVar11,(u8 *)local_90,local_88,(u8 *)0x0,0,(int *)&local_9c);
    (pCur_00->info).nSize = 0;
    if (pMVar13->nOverflow != '\0') {
      pCur_00->curFlags = pCur_00->curFlags & 0xfd;
      local_9c = balance(pCur_00);
      pCur_00->apPage[pCur_00->iPage]->nOverflow = '\0';
      pCur_00->eState = '\0';
      if ((local_9c == 0 & (byte)local_84 >> 1) == 1) {
        local_9c = moveToRoot(pCur_00);
        if (pCur_00->pKeyInfo != (KeyInfo *)0x0) {
          __dest = sqlite3Malloc(pBVar4->nKey);
          pCur_00->pKey = __dest;
          if (__dest == (void *)0x0) {
            local_9c = 7;
          }
          else {
            memcpy(__dest,pBVar4->pKey,pBVar4->nKey);
          }
        }
        pCur_00->eState = '\x03';
        pCur_00->nKey = pBVar4->nKey;
      }
    }
  }
  return local_9c;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeInsert(
  BtCursor *pCur,                /* Insert data into the table of this cursor */
  const BtreePayload *pX,        /* Content of the row to be inserted */
  int flags,                     /* True if this is likely an append */
  int seekResult                 /* Result of prior MovetoUnpacked() call */
){
  int rc;
  int loc = seekResult;          /* -1: before desired location  +1: after */
  int szNew = 0;
  int idx;
  MemPage *pPage;
  Btree *p = pCur->pBtree;
  BtShared *pBt = p->pBt;
  unsigned char *oldCell;
  unsigned char *newCell = 0;

  assert( (flags & (BTREE_SAVEPOSITION|BTREE_APPEND))==flags );

  if( pCur->eState==CURSOR_FAULT ){
    assert( pCur->skipNext!=SQLITE_OK );
    return pCur->skipNext;
  }

  assert( cursorOwnsBtShared(pCur) );
  assert( (pCur->curFlags & BTCF_WriteFlag)!=0
              && pBt->inTransaction==TRANS_WRITE
              && (pBt->btsFlags & BTS_READ_ONLY)==0 );
  assert( hasSharedCacheTableLock(p, pCur->pgnoRoot, pCur->pKeyInfo!=0, 2) );

  /* Assert that the caller has been consistent. If this cursor was opened
  ** expecting an index b-tree, then the caller should be inserting blob
  ** keys with no associated data. If the cursor was opened expecting an
  ** intkey table, the caller should be inserting integer keys with a
  ** blob of associated data.  */
  assert( (pX->pKey==0)==(pCur->pKeyInfo==0) );

  /* Save the positions of any other cursors open on this table.
  **
  ** In some cases, the call to btreeMoveto() below is a no-op. For
  ** example, when inserting data into a table with auto-generated integer
  ** keys, the VDBE layer invokes sqlite3BtreeLast() to figure out the 
  ** integer key to use. It then calls this function to actually insert the 
  ** data into the intkey B-Tree. In this case btreeMoveto() recognizes
  ** that the cursor is already where it needs to be and returns without
  ** doing any work. To avoid thwarting these optimizations, it is important
  ** not to clear the cursor here.
  */
  if( pCur->curFlags & BTCF_Multiple ){
    rc = saveAllCursors(pBt, pCur->pgnoRoot, pCur);
    if( rc ) return rc;
  }

  if( pCur->pKeyInfo==0 ){
    assert( pX->pKey==0 );
    /* If this is an insert into a table b-tree, invalidate any incrblob 
    ** cursors open on the row being replaced */
    invalidateIncrblobCursors(p, pX->nKey, 0);

    /* If BTREE_SAVEPOSITION is set, the cursor must already be pointing 
    ** to a row with the same key as the new entry being inserted.  */
    assert( (flags & BTREE_SAVEPOSITION)==0 || 
            ((pCur->curFlags&BTCF_ValidNKey)!=0 && pX->nKey==pCur->info.nKey) );

    /* If the cursor is currently on the last row and we are appending a
    ** new row onto the end, set the "loc" to avoid an unnecessary
    ** btreeMoveto() call */
    if( (pCur->curFlags&BTCF_ValidNKey)!=0 && pX->nKey==pCur->info.nKey ){
      loc = 0;
    }else if( (pCur->curFlags&BTCF_ValidNKey)!=0 && pX->nKey>0
               && pCur->info.nKey==pX->nKey-1 ){
      loc = -1;
    }else if( loc==0 ){
      rc = sqlite3BtreeMovetoUnpacked(pCur, 0, pX->nKey, flags!=0, &loc);
      if( rc ) return rc;
    }
  }else if( loc==0 && (flags & BTREE_SAVEPOSITION)==0 ){
    if( pX->nMem ){
      UnpackedRecord r;
      r.pKeyInfo = pCur->pKeyInfo;
      r.aMem = pX->aMem;
      r.nField = pX->nMem;
      r.default_rc = 0;
      r.errCode = 0;
      r.r1 = 0;
      r.r2 = 0;
      r.eqSeen = 0;
      rc = sqlite3BtreeMovetoUnpacked(pCur, &r, 0, flags!=0, &loc);
    }else{
      rc = btreeMoveto(pCur, pX->pKey, pX->nKey, flags!=0, &loc);
    }
    if( rc ) return rc;
  }
  assert( pCur->eState==CURSOR_VALID || (pCur->eState==CURSOR_INVALID && loc) );

  pPage = pCur->apPage[pCur->iPage];
  assert( pPage->intKey || pX->nKey>=0 );
  assert( pPage->leaf || !pPage->intKey );

  TRACE(("INSERT: table=%d nkey=%lld ndata=%d page=%d %s\n",
          pCur->pgnoRoot, pX->nKey, pX->nData, pPage->pgno,
          loc==0 ? "overwrite" : "new entry"));
  assert( pPage->isInit );
  newCell = pBt->pTmpSpace;
  assert( newCell!=0 );
  rc = fillInCell(pPage, newCell, pX, &szNew);
  if( rc ) goto end_insert;
  assert( szNew==pPage->xCellSize(pPage, newCell) );
  assert( szNew <= MX_CELL_SIZE(pBt) );
  idx = pCur->aiIdx[pCur->iPage];
  if( loc==0 ){
    CellInfo info;
    assert( idx<pPage->nCell );
    rc = sqlite3PagerWrite(pPage->pDbPage);
    if( rc ){
      goto end_insert;
    }
    oldCell = findCell(pPage, idx);
    if( !pPage->leaf ){
      memcpy(newCell, oldCell, 4);
    }
    rc = clearCell(pPage, oldCell, &info);
    if( info.nSize==szNew && info.nLocal==info.nPayload ){
      /* Overwrite the old cell with the new if they are the same size.
      ** We could also try to do this if the old cell is smaller, then add
      ** the leftover space to the free list.  But experiments show that
      ** doing that is no faster then skipping this optimization and just
      ** calling dropCell() and insertCell(). */
      assert( rc==SQLITE_OK ); /* clearCell never fails when nLocal==nPayload */
      if( oldCell+szNew > pPage->aDataEnd ) return SQLITE_CORRUPT_BKPT;
      memcpy(oldCell, newCell, szNew);
      return SQLITE_OK;
    }
    dropCell(pPage, idx, info.nSize, &rc);
    if( rc ) goto end_insert;
  }else if( loc<0 && pPage->nCell>0 ){
    assert( pPage->leaf );
    idx = ++pCur->aiIdx[pCur->iPage];
  }else{
    assert( pPage->leaf );
  }
  insertCell(pPage, idx, newCell, szNew, 0, 0, &rc);
  assert( pPage->nOverflow==0 || rc==SQLITE_OK );
  assert( rc!=SQLITE_OK || pPage->nCell>0 || pPage->nOverflow>0 );

  /* If no error has occurred and pPage has an overflow cell, call balance() 
  ** to redistribute the cells within the tree. Since balance() may move
  ** the cursor, zero the BtCursor.info.nSize and BTCF_ValidNKey
  ** variables.
  **
  ** Previous versions of SQLite called moveToRoot() to move the cursor
  ** back to the root page as balance() used to invalidate the contents
  ** of BtCursor.apPage[] and BtCursor.aiIdx[]. Instead of doing that,
  ** set the cursor state to "invalid". This makes common insert operations
  ** slightly faster.
  **
  ** There is a subtle but important optimization here too. When inserting
  ** multiple records into an intkey b-tree using a single cursor (as can
  ** happen while processing an "INSERT INTO ... SELECT" statement), it
  ** is advantageous to leave the cursor pointing to the last entry in
  ** the b-tree if possible. If the cursor is left pointing to the last
  ** entry in the table, and the next row inserted has an integer key
  ** larger than the largest existing key, it is possible to insert the
  ** row without seeking the cursor. This can be a big performance boost.
  */
  pCur->info.nSize = 0;
  if( pPage->nOverflow ){
    assert( rc==SQLITE_OK );
    pCur->curFlags &= ~(BTCF_ValidNKey);
    rc = balance(pCur);

    /* Must make sure nOverflow is reset to zero even if the balance()
    ** fails. Internal data structure corruption will result otherwise. 
    ** Also, set the cursor state to invalid. This stops saveCursorPosition()
    ** from trying to save the current position of the cursor.  */
    pCur->apPage[pCur->iPage]->nOverflow = 0;
    pCur->eState = CURSOR_INVALID;
    if( (flags & BTREE_SAVEPOSITION) && rc==SQLITE_OK ){
      rc = moveToRoot(pCur);
      if( pCur->pKeyInfo ){
        assert( pCur->pKey==0 );
        pCur->pKey = sqlite3Malloc( pX->nKey );
        if( pCur->pKey==0 ){
          rc = SQLITE_NOMEM;
        }else{
          memcpy(pCur->pKey, pX->pKey, pX->nKey);
        }
      }
      pCur->eState = CURSOR_REQUIRESEEK;
      pCur->nKey = pX->nKey;
    }
  }
  assert( pCur->apPage[pCur->iPage]->nOverflow==0 );

end_insert:
  return rc;
}